

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::detail::checkIfShouldThrow(Enum at)

{
  int iVar1;
  int iVar2;
  ContextOptions *pCVar3;
  bool local_9;
  Enum at_local;
  
  if ((at & is_require) == 0) {
    if (((at & is_check) != 0) && (pCVar3 = getContextOptions(), 0 < pCVar3->abort_after)) {
      iVar1 = *(int *)(g_cs + 0xa0);
      iVar2 = MultiLaneAtomic::operator_cast_to_int((MultiLaneAtomic *)(g_cs + 0x8c0));
      pCVar3 = getContextOptions();
      if (pCVar3->abort_after <= iVar1 + iVar2) {
        return true;
      }
    }
    local_9 = false;
  }
  else {
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool checkIfShouldThrow(assertType::Enum at) {
        if(at & assertType::is_require) //!OCLINT bitwise operator in conditional
            return true;

        if((at & assertType::is_check) //!OCLINT bitwise operator in conditional
           && getContextOptions()->abort_after > 0 &&
           (g_cs->numAssertsFailed + g_cs->numAssertsFailedCurrentTest_atomic) >=
                   getContextOptions()->abort_after)
            return true;

        return false;
    }